

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

Bool tidyOptGetBool(TidyDoc tdoc,TidyOptionId optId)

{
  TidyOptionImpl *pTVar1;
  TidyOptionImpl *option;
  Bool optb;
  TidyDocImpl *impl;
  TidyOptionId optId_local;
  TidyDoc tdoc_local;
  
  option._4_4_ = no;
  if ((tdoc != (TidyDoc)0x0) && (pTVar1 = prvTidygetOption(optId), pTVar1 != (TidyOptionImpl *)0x0))
  {
    option._4_4_ = (Bool)*(undefined8 *)(tdoc + (ulong)optId * 2 + 0x1c);
  }
  return option._4_4_;
}

Assistant:

Bool TIDY_CALL         tidyOptGetBool( TidyDoc tdoc, TidyOptionId optId )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    Bool optb = no;
    if ( impl )
    {
        const TidyOptionImpl* option = TY_(getOption)( optId );
        if ( option )
        {
            optb = cfgBool( impl, optId );
        }
    }
    return optb;
}